

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O1

void __thiscall MathOp::PRandM::PRandM(PRandM *this,Mat *r_nd,Mat *r_st,int k,int m)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  ulong *puVar4;
  ulong uVar5;
  Mat *this_00;
  ulong uVar6;
  long lVar7;
  
  uVar5 = (ulong)m;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar3 = SUB168(auVar1 * ZEXT816(0x28),0);
  uVar6 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  (this->super_Op)._vptr_Op = (_func_int **)&PTR_forward_0012d618;
  if (SUB168(auVar1 * ZEXT816(0x28),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  uVar2 = Mat::rows(r_nd);
  Mat::cols(r_nd);
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar5;
  if (m != 0) {
    lVar7 = 0;
    this_00 = (Mat *)(puVar4 + 1);
    do {
      Mat::Mat(this_00);
      lVar7 = lVar7 + -0x28;
      this_00 = this_00 + 1;
    } while (-lVar7 != uVar5 * 0x28);
  }
  this->b_B = (Mat *)(puVar4 + 1);
  if (0 < m) {
    lVar7 = 0;
    do {
      Mat::init((Mat *)((long)&this->b_B->r + lVar7),(EVP_PKEY_CTX *)(ulong)uVar2);
      lVar7 = lVar7 + 0x28;
    } while ((ulong)(uint)m * 0x28 != lVar7);
  }
  PRandM_init(this,r_nd,r_st,this->b_B,k,m);
  return;
}

Assistant:

MathOp::PRandM::PRandM(Mat *r_nd, Mat *r_st, int k, int m) {
    int tmp_r, tmp_c;
    tmp_r = r_nd->rows();
    tmp_c = r_nd->cols();
    b_B = new Mat[m];
    for (int i = 0; i < m; i++) {
        b_B[i].init(tmp_r, tmp_c);
    }
    PRandM_init(r_nd, r_st, b_B, k, m);
}